

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# concur19.cc
# Opt level: O2

void __thiscall
tchecker::tck_reach::concur19::node_le_t::node_le_t(node_le_t *this,system_t *system)

{
  clock_id_t cVar1;
  clockbounds_t *__p;
  map_t *pmVar2;
  
  __p = clockbounds::compute_clockbounds(system);
  std::__shared_ptr<tchecker::clockbounds::clockbounds_t,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<tchecker::clockbounds::clockbounds_t,void>
            ((__shared_ptr<tchecker::clockbounds::clockbounds_t,(__gnu_cxx::_Lock_policy)2> *)this,
             __p);
  cVar1 = clockbounds::clockbounds_t::clocks_number
                    ((this->_clockbounds).
                     super___shared_ptr<tchecker::clockbounds::clockbounds_t,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr);
  pmVar2 = clockbounds::allocate_map((ulong)cVar1);
  this->_l = pmVar2;
  cVar1 = clockbounds::clockbounds_t::clocks_number
                    ((this->_clockbounds).
                     super___shared_ptr<tchecker::clockbounds::clockbounds_t,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr);
  pmVar2 = clockbounds::allocate_map((ulong)cVar1);
  this->_u = pmVar2;
  return;
}

Assistant:

node_le_t::node_le_t(tchecker::ta::system_t const & system) : _clockbounds(tchecker::clockbounds::compute_clockbounds(system))
{
  _l = tchecker::clockbounds::allocate_map(_clockbounds->clocks_number());
  _u = tchecker::clockbounds::allocate_map(_clockbounds->clocks_number());
}